

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_7e76ab::TLL::TLL(TLL *this,cmMakefile *mf,cmTarget *target)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  cmMakefile *pcVar3;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string local_70;
  undefined1 local_50 [8];
  cmDirectoryId dirId;
  cmTarget *target_local;
  cmMakefile *mf_local;
  TLL *this_local;
  
  this->Makefile = mf;
  this->Target = target;
  this->WarnRemoteInterface = false;
  this->RejectRemoteLinking = false;
  this->EncodeRemoteReference = false;
  std::__cxx11::string::string((string *)&this->DirectoryId);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->Props);
  pcVar1 = this->Makefile;
  pcVar3 = cmTarget::GetMakefile(this->Target);
  if (pcVar1 != pcVar3) {
    PVar2 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0079,false);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) {
        if (PVar2 - NEW < 3) {
          this->EncodeRemoteReference = true;
        }
        goto LAB_00490787;
      }
      this->WarnRemoteInterface = true;
    }
    this->RejectRemoteLinking = true;
  }
LAB_00490787:
  if ((this->EncodeRemoteReference & 1U) != 0) {
    cmMakefile::GetDirectoryId((cmDirectoryId *)local_50,this->Makefile);
    cmAlphaNum::cmAlphaNum(&local_a0,"::@");
    cmAlphaNum::cmAlphaNum(&local_d0,(string *)local_50);
    cmStrCat<>(&local_70,&local_a0,&local_d0);
    std::__cxx11::string::operator=((string *)&this->DirectoryId,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    cmDirectoryId::~cmDirectoryId((cmDirectoryId *)local_50);
  }
  return;
}

Assistant:

TLL::TLL(cmMakefile& mf, cmTarget* target)
  : Makefile(mf)
  , Target(target)
{
  if (&this->Makefile != this->Target->GetMakefile()) {
    // The LHS target was created in another directory.
    switch (this->Makefile.GetPolicyStatus(cmPolicies::CMP0079)) {
      case cmPolicies::WARN:
        this->WarnRemoteInterface = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        this->RejectRemoteLinking = true;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        this->EncodeRemoteReference = true;
        break;
    }
  }
  if (this->EncodeRemoteReference) {
    cmDirectoryId const dirId = this->Makefile.GetDirectoryId();
    this->DirectoryId = cmStrCat(CMAKE_DIRECTORY_ID_SEP, dirId.String);
  }
}